

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O0

void __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::SamplingStrategyResponse
          (SamplingStrategyResponse *this,SamplingStrategyResponse *other15)

{
  SamplingStrategyResponse *other15_local;
  SamplingStrategyResponse *this_local;
  
  apache::thrift::TBase::TBase((TBase *)this);
  *(undefined ***)this = &PTR__SamplingStrategyResponse_004fd480;
  *(undefined ***)this = &PTR__SamplingStrategyResponse_004fd480;
  ProbabilisticSamplingStrategy::ProbabilisticSamplingStrategy(&this->probabilisticSampling);
  RateLimitingSamplingStrategy::RateLimitingSamplingStrategy(&this->rateLimitingSampling);
  PerOperationSamplingStrategies::PerOperationSamplingStrategies(&this->operationSampling);
  _SamplingStrategyResponse__isset::_SamplingStrategyResponse__isset(&this->__isset);
  this->strategyType = other15->strategyType;
  ProbabilisticSamplingStrategy::operator=
            (&this->probabilisticSampling,&other15->probabilisticSampling);
  RateLimitingSamplingStrategy::operator=
            (&this->rateLimitingSampling,&other15->rateLimitingSampling);
  PerOperationSamplingStrategies::operator=(&this->operationSampling,&other15->operationSampling);
  this->__isset = other15->__isset;
  return;
}

Assistant:

SamplingStrategyResponse::SamplingStrategyResponse(const SamplingStrategyResponse& other15) {
  strategyType = other15.strategyType;
  probabilisticSampling = other15.probabilisticSampling;
  rateLimitingSampling = other15.rateLimitingSampling;
  operationSampling = other15.operationSampling;
  __isset = other15.__isset;
}